

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O0

void __thiscall Fl_Pixmap::delete_data(Fl_Pixmap *this)

{
  int iVar1;
  char **ppcVar2;
  int local_14;
  int i;
  Fl_Pixmap *this_local;
  
  if (this->alloc_data != 0) {
    for (local_14 = 0; iVar1 = Fl_Image::count(&this->super_Fl_Image), local_14 < iVar1;
        local_14 = local_14 + 1) {
      ppcVar2 = Fl_Image::data(&this->super_Fl_Image);
      if (ppcVar2[local_14] != (char *)0x0) {
        operator_delete__(ppcVar2[local_14]);
      }
    }
    ppcVar2 = Fl_Image::data(&this->super_Fl_Image);
    if (ppcVar2 != (char **)0x0) {
      operator_delete__(ppcVar2);
    }
  }
  return;
}

Assistant:

void Fl_Pixmap::delete_data() {
  if (alloc_data) {
    for (int i = 0; i < count(); i ++) delete[] (char *)data()[i];
    delete[] (char **)data();
  }
}